

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedFile.cpp
# Opt level: O1

void __thiscall cat::MappedView::Close(MappedView *this)

{
  if (this->Map != (void *)0xffffffffffffffff) {
    munmap(this->Map,(ulong)this->Length);
    this->Map = (void *)0xffffffffffffffff;
  }
  this->Data = (uint8_t *)0x0;
  this->Offset = 0;
  this->Length = 0;
  return;
}

Assistant:

void MappedView::Close()
{
#if defined(CAT_OS_WINDOWS)

    if (Data)
    {
        ::UnmapViewOfFile(Data);
        Data = 0;
    }

    if (Map)
    {
        ::CloseHandle(Map);
        Map = 0;
    }

#else

    if (Map != MAP_FAILED)
    {
        munmap(Map, Length);
        Map = MAP_FAILED;
    }

    Data = 0;

#endif

    Length = 0;
    Offset = 0;
}